

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O3

void __thiscall DynamicGraph::buildBFSStructure(DynamicGraph *this,Vertex *s)

{
  StoredVertexList *this_00;
  size_t *psVar1;
  pointer psVar2;
  stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>
  *psVar3;
  back_insertion_sequence_tag bVar4;
  _List_node_base *p_Var5;
  __normal_iterator<const_boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>
  _Var6;
  pointer puVar7;
  pointer puVar8;
  back_insertion_sequence_tag bVar9;
  AdjList *g;
  long lVar10;
  vertex_descriptor x;
  _Bit_iterator _Var11;
  pair<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_bool>
  pVar12;
  back_insertion_sequence_tag local_98;
  undefined8 local_90;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_88;
  undefined1 local_70;
  back_insertion_sequence_tag local_68;
  vector<bool,_std::allocator<bool>_> local_60;
  _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
  *local_38;
  
  local_88.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
       local_88.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_60,
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_88,
             (allocator_type *)&local_98);
  this->nextComponent = this->nextComponent + 1;
  bfs(this,s,&local_60,0);
  this_00 = &(this->super_UndirectedGraph).super_type.m_vertices;
  local_38 = (_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
              *)&this->virtualEdges;
  while( true ) {
    local_88.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         local_88.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source &
         0xffffffff00000000;
    _Var11 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                       (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,
                        &local_88);
    if ((_Var11.super__Bit_iterator_base._M_p ==
         local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_p) &&
       (_Var11.super__Bit_iterator_base._M_offset ==
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset)) break;
    local_68 = (back_insertion_sequence_tag)0x1;
    puVar7 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar8 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (8 < (ulong)((long)puVar8 - (long)puVar7)) {
      lVar10 = 0x20;
      do {
        bVar4 = local_68;
        bVar9 = (back_insertion_sequence_tag)((long)local_68 + 0x3f);
        if (-1 < (long)local_68) {
          bVar9 = local_68;
        }
        if ((local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)bVar9 >> 6) +
              ((ulong)(((ulong)local_68 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
             ((ulong)local_68 & 0x3f) & 1) == 0) {
          if ((ulong)((long)(this->super_UndirectedGraph).super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_UndirectedGraph).super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)local_68) {
            std::
            vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ::resize(this_00,(size_type)((long)local_68 + 1));
          }
          p_Var5 = (_List_node_base *)operator_new(0x28);
          p_Var5[1]._M_next = (_List_node_base *)0x0;
          p_Var5[1]._M_prev = (_List_node_base *)bVar4;
          std::__detail::_List_node_base::_M_hook(p_Var5);
          psVar1 = &(this->super_UndirectedGraph).super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          p_Var5 = *(_List_node_base **)
                    ((long)&(this->super_UndirectedGraph).super_type.m_edges.
                            super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                            ._M_impl._M_node.super__List_node_base + 8);
          local_98 = (back_insertion_sequence_tag)&Action::vtable;
          local_88.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
               (unsigned_long)bVar4;
          local_88.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
               (unsigned_long)p_Var5;
          pVar12 = boost::graph_detail::
                   push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                             ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                               *)(this->super_UndirectedGraph).super_type.m_vertices.
                                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                              (stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>
                               *)&local_88,&local_98);
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            psVar1 = &(this->super_UndirectedGraph).super_type.m_edges.
                      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(p_Var5,0x28);
          }
          else {
            local_88.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0;
            local_98 = (back_insertion_sequence_tag)&Action::vtable;
            local_88.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
                 (unsigned_long)p_Var5;
            boost::graph_detail::
            push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                      ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                        *)((long)&(((this_00->
                                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->super_StoredVertex)
                                  .m_out_edges.
                                  super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                          + lVar10),
                       (stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>
                        *)&local_88,&local_98);
          }
          psVar2 = (this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_90 = 0;
          local_98 = bVar4;
          _Var6 = std::
                  __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                            (*(undefined8 *)
                              &(psVar2->super_StoredVertex).m_out_edges.
                               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                             ,*(pointer *)
                               ((long)&(psVar2->super_StoredVertex).m_out_edges.
                                       super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                               + 8),&local_98);
          psVar3 = *(pointer *)
                    ((long)&(psVar2->super_StoredVertex).m_out_edges.
                            super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                    + 8);
          if (_Var6._M_current == psVar3) {
            local_88.m_eproperty = (_List_node_base *)0x0;
          }
          else {
            local_88.m_eproperty = ((_Var6._M_current)->m_iter)._M_node + 2;
          }
          local_70 = _Var6._M_current != psVar3;
          local_88.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0;
          local_88.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
               (unsigned_long)bVar4;
          std::
          _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
          ::_M_insert_unique<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>
                    (local_38,&local_88);
          this->nextComponent = this->nextComponent + 1;
          bfs(this,(Vertex *)&local_68,&local_60,1);
          puVar7 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar8 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        local_68 = (back_insertion_sequence_tag)((long)bVar4 + 1);
        lVar10 = lVar10 + 0x20;
      } while ((ulong)local_68 < (ulong)((long)puVar8 - (long)puVar7 >> 3));
    }
  }
  if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void DynamicGraph::buildBFSStructure(const Vertex &s)
{
    std::vector<bool> visited(boost::num_vertices(*this));
    this->nextComponent++;
    this->bfs(s, visited, 0);

    // While not visited notes exist
    while(std::find(visited.begin(), visited.end(), 0) != visited.end() ) {
        // For each note not visited yet
        for(Vertex i=1; i<level.size(); ++i ) {
            // Add a virtual edge
            if(!visited[i]){
                boost::add_edge(0, i, *this);
                this->virtualEdges.insert(edge(0,i,*this).first);
                this->nextComponent++;

                // And continue scanning from here
                this->bfs(i, visited, 1);
            }
        }
    }
}